

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O0

float ncnn::get_value_bounded(Mat *image,int x,int y,int padding_mode,int align_corner)

{
  int sx;
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  float fVar2;
  
  sx = compute_coord(in_ESI,in_EDX,in_ECX,in_R8D);
  iVar1 = compute_coord(sx,in_EDX,in_ECX,in_R8D);
  fVar2 = get_value_bounded((Mat *)CONCAT44(sx,iVar1),in_ECX,in_R8D);
  return fVar2;
}

Assistant:

static float get_value_bounded(const Mat& image, int x, int y, int padding_mode, int align_corner)
{
    x = compute_coord(x, image.w, padding_mode, align_corner);
    y = compute_coord(y, image.h, padding_mode, align_corner);

    return get_value_bounded(image, x, y);
}